

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstream.cpp
# Opt level: O3

void __thiscall string_stream_erase_Test::TestBody(string_stream_erase_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  string_stream ss;
  undefined1 local_178 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  char acStack_168 [16];
  AssertHelper local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  string local_148;
  string_stream local_128;
  
  local_128.m_chars = local_128.m_stack;
  local_128.m_alloc = 0x100;
  local_128.m_size = 0;
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5;
  acStack_168[6] = '\0';
  acStack_168[7] = '\0';
  acStack_168[8] = '\0';
  acStack_168[9] = '\0';
  acStack_168[10] = '\0';
  acStack_168[0xb] = '\0';
  acStack_168[0xc] = '\0';
  acStack_168[0xd] = '\0';
  acStack_168[0xe] = '\0';
  acStack_168[0xf] = '\0';
  builtin_strncpy(acStack_168,"aaaaa",6);
  local_178 = (undefined1  [8])acStack_168;
  ST::string_stream::append(&local_128,acStack_168,5);
  if ((0xf < local_170) &&
     ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_178 !=
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0)) {
    operator_delete__((void *)local_178);
  }
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000a;
  builtin_strncpy(acStack_168,"bbbbbbbbbb",0xb);
  acStack_168[0xb] = '\0';
  acStack_168[0xc] = '\0';
  acStack_168[0xd] = '\0';
  acStack_168[0xe] = '\0';
  acStack_168[0xf] = '\0';
  local_178 = (undefined1  [8])acStack_168;
  ST::string_stream::append(&local_128,acStack_168,10);
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f <
       local_170) && (local_178 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_178);
  }
  local_148.m_buffer.m_chars = (char *)(long *)0x0;
  if (4 < local_128.m_size) {
    local_148.m_buffer.m_chars = (char *)(local_128.m_size - 5);
  }
  local_158.data_._0_4_ = 10;
  local_128.m_size = (size_t)local_148.m_buffer.m_chars;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_178,"10U","ss.size()",(uint *)&local_158,(unsigned_long *)&local_148)
  ;
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_148);
    if (local_170 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_170->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_sstream.cpp"
               ,0x136,pcVar1);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((long *)local_148.m_buffer.m_chars != (long *)0x0) {
      (**(code **)(*(long *)local_148.m_buffer.m_chars + 8))();
    }
  }
  if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_170,local_170);
  }
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000a;
  builtin_strncpy(acStack_168,"aaaaabbbbb",0xb);
  acStack_168[0xb] = '\0';
  acStack_168[0xc] = '\0';
  acStack_168[0xd] = '\0';
  acStack_168[0xe] = '\0';
  acStack_168[0xf] = '\0';
  local_178 = (undefined1  [8])acStack_168;
  ST::string::from_utf8(&local_148,local_128.m_chars,local_128.m_size,check_validity);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            ((internal *)&local_158,
             "ST::string::from_validated(\"\" \"aaaaabbbbb\" \"\", sizeof(\"aaaaabbbbb\") - 1)",
             "ss.to_string()",(string *)local_178,&local_148);
  if ((0xf < local_148.m_buffer.m_size) && ((long *)local_148.m_buffer.m_chars != (long *)0x0)) {
    operator_delete__(local_148.m_buffer.m_chars);
  }
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f <
       local_170) && (local_178 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_178);
  }
  if (local_158.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_178);
    if (local_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_sstream.cpp"
               ,0x137,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_178 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_178 + 8))();
    }
  }
  if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_150,local_150);
  }
  local_148.m_buffer.m_chars = (char *)(long *)0x0;
  if (&DAT_00000009 < local_128.m_size) {
    local_148.m_buffer.m_chars = (char *)(local_128.m_size + -10);
  }
  local_158.data_._0_4_ = 0;
  local_128.m_size = (size_t)local_148.m_buffer.m_chars;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_178,"0U","ss.size()",(uint *)&local_158,(unsigned_long *)&local_148);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_148);
    if (local_170 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_170->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_sstream.cpp"
               ,0x13a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((long *)local_148.m_buffer.m_chars != (long *)0x0) {
      (**(code **)(*(long *)local_148.m_buffer.m_chars + 8))();
    }
  }
  if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_170,local_170);
  }
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  acStack_168[0] = '\0';
  acStack_168[1] = '\0';
  acStack_168[2] = '\0';
  acStack_168[3] = '\0';
  acStack_168[4] = '\0';
  acStack_168[5] = '\0';
  acStack_168[6] = '\0';
  acStack_168[7] = '\0';
  acStack_168[8] = '\0';
  acStack_168[9] = '\0';
  acStack_168[10] = '\0';
  acStack_168[0xb] = '\0';
  acStack_168[0xc] = '\0';
  acStack_168[0xd] = '\0';
  acStack_168[0xe] = '\0';
  acStack_168[0xf] = '\0';
  local_178 = (undefined1  [8])acStack_168;
  ST::string::from_utf8(&local_148,local_128.m_chars,local_128.m_size,check_validity);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            ((internal *)&local_158,"ST::string()","ss.to_string()",(string *)local_178,&local_148);
  if ((0xf < local_148.m_buffer.m_size) && ((long *)local_148.m_buffer.m_chars != (long *)0x0)) {
    operator_delete__(local_148.m_buffer.m_chars);
  }
  if ((0xf < local_170) && (local_178 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_178);
  }
  if (local_158.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_178);
    if (local_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_sstream.cpp"
               ,0x13b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_178 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_178 + 8))();
    }
  }
  if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_150,local_150);
  }
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5;
  acStack_168[6] = '\0';
  acStack_168[7] = '\0';
  acStack_168[8] = '\0';
  acStack_168[9] = '\0';
  acStack_168[10] = '\0';
  acStack_168[0xb] = '\0';
  acStack_168[0xc] = '\0';
  acStack_168[0xd] = '\0';
  acStack_168[0xe] = '\0';
  acStack_168[0xf] = '\0';
  builtin_strncpy(acStack_168,"ccccc",6);
  local_178 = (undefined1  [8])acStack_168;
  ST::string_stream::append(&local_128,acStack_168,5);
  if ((0xf < local_170) &&
     ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_178 !=
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0)) {
    operator_delete__((void *)local_178);
  }
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000a;
  builtin_strncpy(acStack_168,"dddddddddd",0xb);
  acStack_168[0xb] = '\0';
  acStack_168[0xc] = '\0';
  acStack_168[0xd] = '\0';
  acStack_168[0xe] = '\0';
  acStack_168[0xf] = '\0';
  local_178 = (undefined1  [8])acStack_168;
  ST::string_stream::append(&local_128,acStack_168,10);
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f <
       local_170) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_178 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_178);
  }
  local_158.data_._0_4_ = 0xf;
  local_148.m_buffer.m_chars = (char *)local_128.m_size;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_178,"15U","ss.size()",(uint *)&local_158,(unsigned_long *)&local_148)
  ;
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_148);
    if (local_170 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_170->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_sstream.cpp"
               ,0x13f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((long *)local_148.m_buffer.m_chars != (long *)0x0) {
      (**(code **)(*(long *)local_148.m_buffer.m_chars + 8))();
    }
  }
  if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_170,local_170);
  }
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f;
  builtin_strncpy(acStack_168,"cccccdddddddddd",0x10);
  local_178 = (undefined1  [8])acStack_168;
  ST::string::from_utf8(&local_148,local_128.m_chars,local_128.m_size,check_validity);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            ((internal *)&local_158,
             "ST::string::from_validated(\"\" \"cccccdddddddddd\" \"\", sizeof(\"cccccdddddddddd\") - 1)"
             ,"ss.to_string()",(string *)local_178,&local_148);
  if ((0xf < local_148.m_buffer.m_size) && ((long *)local_148.m_buffer.m_chars != (long *)0x0)) {
    operator_delete__(local_148.m_buffer.m_chars);
  }
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f <
       local_170) && (local_178 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_178);
  }
  if (local_158.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_178);
    if (local_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_sstream.cpp"
               ,0x140,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_178 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_178 + 8))();
    }
  }
  if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_150,local_150);
  }
  local_148.m_buffer.m_chars = (char *)(long *)0x0;
  if ((long *)0x1d < local_128.m_size) {
    local_148.m_buffer.m_chars = (char *)(local_128.m_size + -0x1e);
  }
  local_158.data_._0_4_ = 0;
  local_128.m_size = (size_t)local_148.m_buffer.m_chars;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_178,"0U","ss.size()",(uint *)&local_158,(unsigned_long *)&local_148);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_148);
    if (local_170 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_170->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_sstream.cpp"
               ,0x143,pcVar1);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((long *)local_148.m_buffer.m_chars != (long *)0x0) {
      (**(code **)(*(long *)local_148.m_buffer.m_chars + 8))();
    }
  }
  if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_170,local_170);
  }
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  acStack_168[0] = '\0';
  acStack_168[1] = '\0';
  acStack_168[2] = '\0';
  acStack_168[3] = '\0';
  acStack_168[4] = '\0';
  acStack_168[5] = '\0';
  acStack_168[6] = '\0';
  acStack_168[7] = '\0';
  acStack_168[8] = '\0';
  acStack_168[9] = '\0';
  acStack_168[10] = '\0';
  acStack_168[0xb] = '\0';
  acStack_168[0xc] = '\0';
  acStack_168[0xd] = '\0';
  acStack_168[0xe] = '\0';
  acStack_168[0xf] = '\0';
  local_178 = (undefined1  [8])acStack_168;
  ST::string::from_utf8(&local_148,local_128.m_chars,local_128.m_size,check_validity);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            ((internal *)&local_158,"ST::string()","ss.to_string()",(string *)local_178,&local_148);
  if ((0xf < local_148.m_buffer.m_size) && ((long *)local_148.m_buffer.m_chars != (long *)0x0)) {
    operator_delete__(local_148.m_buffer.m_chars);
  }
  if ((0xf < local_170) && (local_178 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_178);
  }
  if (local_158.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_178);
    if (local_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_sstream.cpp"
               ,0x144,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_178 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_178 + 8))();
    }
  }
  if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_150,local_150);
  }
  if ((0x100 < local_128.m_alloc) && (local_128.m_chars != (char *)0x0)) {
    operator_delete__(local_128.m_chars);
  }
  return;
}

Assistant:

TEST(string_stream, empty)
{
    ST::string_stream ss;
    EXPECT_EQ(0U, ss.size());
    EXPECT_EQ(ST_LITERAL(""), ss.to_string());

    ss << "";
    EXPECT_EQ(0U, ss.size());
    EXPECT_EQ(ST_LITERAL(""), ss.to_string());

    ss.append("", 0);
    EXPECT_EQ(0U, ss.size());
    EXPECT_EQ(ST_LITERAL(""), ss.to_string());

    ss.append(nullptr, 0);
    EXPECT_EQ(0U, ss.size());
    EXPECT_EQ(ST_LITERAL(""), ss.to_string());
}